

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::StructuredAssignmentPatternExpression::forDynamicArray
          (Compilation *comp,StructuredAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Type *elementType,SourceRange sourceRange)

{
  SourceRange range;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  optional<int> value;
  BumpAllocator *__addr;
  undefined1 uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ExpressionKind EVar5;
  AssignmentPatternItemSyntax *indexMap_00;
  SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter> *indexSetters_00;
  ExpressionSyntax *pEVar6;
  undefined4 extraout_var;
  int *piVar7;
  undefined1 *puVar8;
  equal_to<int> *this;
  pointer ppVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  BumpAllocator *in_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  long in_RSI;
  EVP_PKEY_CTX *in_RDI;
  const_iterator cVar10;
  SourceRange SVar11;
  StructuredAssignmentPatternExpression *result;
  mapped_type expr;
  size_t i;
  SmallVector<const_slang::ast::Expression_*,_5UL> elements;
  optional<int> index;
  Expression *keyExpr;
  AssignmentPatternItemSyntax *item;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax> *__range2;
  size_t maxIndex;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_4UL> indexSetters;
  SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  indexMap;
  bool bad;
  locator loc;
  size_t pos0;
  size_t hash;
  int *k;
  uint n;
  value_type *p;
  value_type *elements_1;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*> *in_stack_fffffffffffffa58;
  Expression *expr_00;
  table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  *in_stack_fffffffffffffa60;
  Compilation *compilation;
  group15<boost::unordered::detail::foa::plain_integral> *in_stack_fffffffffffffa68;
  ASTContext *in_stack_fffffffffffffa70;
  SourceLocation in_stack_fffffffffffffa78;
  SourceLocation in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa88;
  _Storage<int,_true> in_stack_fffffffffffffa8c;
  undefined4 in_stack_fffffffffffffa90;
  DiagCode in_stack_fffffffffffffa94;
  SyntaxNode *in_stack_fffffffffffffab0;
  int *in_stack_fffffffffffffac8;
  try_emplace_args_t *in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad8;
  table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  *this_00;
  table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  *in_stack_fffffffffffffaf0;
  span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  *in_stack_fffffffffffffaf8;
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  *in_stack_fffffffffffffb00;
  undefined7 in_stack_fffffffffffffb08;
  undefined1 in_stack_fffffffffffffb0f;
  _Optional_payload_base<int> in_stack_fffffffffffffb10;
  BumpAllocator *in_stack_fffffffffffffb18;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *in_stack_fffffffffffffb30;
  SourceLocation in_stack_fffffffffffffb38;
  undefined7 in_stack_fffffffffffffba8;
  Expression local_420;
  StructuredAssignmentPatternExpression *local_3d8;
  undefined4 local_3cc;
  Expression *local_3c8;
  pointer local_3c0;
  Segment *local_3b8;
  byte *pbStack_3b0;
  undefined4 local_3a4;
  SmallVectorBase<const_slang::ast::Expression_*> local_3a0 [2];
  unsigned_long local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  _Optional_payload_base<int> local_348;
  _Optional_payload_base<int> local_340;
  SourceRange local_338;
  undefined4 local_324;
  bitmask<slang::ast::ASTFlags> local_320;
  int *local_318;
  SourceRange local_310;
  undefined4 local_2fc;
  AssignmentPatternItemSyntax *local_2f8;
  const_iterator local_2f0;
  const_iterator local_2d0;
  long local_2c0;
  pointer local_2b8;
  SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter> local_2b0 [5];
  table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  local_1d0;
  byte local_191;
  BumpAllocator *local_180;
  long local_178;
  EVP_PKEY_CTX *local_170;
  StructuredAssignmentPatternExpression *local_168;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_160;
  undefined4 *local_148;
  table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  *local_140;
  undefined1 local_131;
  undefined4 *local_130;
  table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  *local_128;
  bool local_119 [25];
  iterator local_100;
  bool local_e9 [25];
  iterator local_d0;
  bool local_b9;
  iterator local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_int,_const_slang::ast::Expression_*>_>
  local_a8;
  size_t local_90;
  span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  *local_88;
  int *local_80;
  undefined4 *local_78;
  undefined1 *local_70;
  table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  *local_20;
  size_t local_18;
  int *local_10;
  table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  *local_8;
  
  compilation = (Compilation *)&stack0x00000008;
  local_191 = 0;
  local_180 = in_RDX;
  local_178 = in_RSI;
  local_170 = in_RDI;
  SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  ::SmallMap((SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
              *)in_stack_fffffffffffffa70);
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_4UL>::SmallVector
            ((SmallVector<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_4UL> *)
             0x9be101);
  local_2b8 = (pointer)0x0;
  local_2c0 = local_178 + 0x28;
  local_2d0 = slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::begin
                        ((SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax> *)0x9be12e
                        );
  cVar10 = slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::end
                     ((SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax> *)0x9be16d);
  local_2f0 = cVar10;
  while( true ) {
    uVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    if (((uVar1 ^ 0xff) & 1) == 0) break;
    indexMap_00 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>,_false>
                  ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>,_false>
                               *)0x9be1dc);
    local_2f8 = indexMap_00;
    indexSetters_00 =
         (SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter> *)
         not_null<slang::syntax::ExpressionSyntax_*>::operator->
                   ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9be207);
    if (((SyntaxNode *)&indexSetters_00->data_)->kind == DefaultPatternKeyExpression) {
      local_2fc = 0xd0007;
      not_null<slang::syntax::ExpressionSyntax_*>::operator->
                ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9be251);
      SVar11 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffab0);
      sourceRange_00.endLoc._0_4_ = in_stack_fffffffffffffa88;
      sourceRange_00.startLoc = in_stack_fffffffffffffa80;
      sourceRange_00.endLoc._4_4_ = in_stack_fffffffffffffa8c._M_value;
      local_310 = SVar11;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa94,
                          sourceRange_00);
      local_191 = 1;
    }
    else {
      pEVar6 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                         ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9be2f7);
      __addr = local_180;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_320,AllowDataType);
      iVar4 = Expression::bind((int)pEVar6,(sockaddr *)__addr,(socklen_t)local_320.m_bits);
      local_318 = (int *)CONCAT44(extraout_var,iVar4);
      bVar2 = Expression::bad((Expression *)in_stack_fffffffffffffa60);
      if (bVar2) {
        local_191 = 1;
      }
      else if (*local_318 == 0x17) {
        local_324 = 0xe0007;
        not_null<slang::syntax::ExpressionSyntax_*>::operator->
                  ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9be3c7);
        SVar11 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffab0);
        in_stack_fffffffffffffb38 = SVar11.endLoc;
        sourceRange_01.endLoc._0_4_ = in_stack_fffffffffffffa88;
        sourceRange_01.startLoc = in_stack_fffffffffffffa80;
        sourceRange_01.endLoc._4_4_ = in_stack_fffffffffffffa8c._M_value;
        local_338 = SVar11;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa94,
                            sourceRange_01);
        local_191 = 1;
      }
      else {
        in_stack_fffffffffffffb18 = local_180;
        in_stack_fffffffffffffb30 =
             (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)
             not_null<slang::syntax::ExpressionSyntax_*>::operator*
                       ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9be484);
        in_stack_fffffffffffffb10 =
             (_Optional_payload_base<int>)
             bindArrayIndexSetter
                       ((ASTContext *)compilation,(Expression *)cVar10.list,(Type *)cVar10.index,
                        (ExpressionSyntax *)CONCAT17(uVar1,in_stack_fffffffffffffba8),
                        (SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                         *)indexMap_00,indexSetters_00);
        local_358 = *(undefined8 *)(local_318 + 8);
        uStack_350 = *(undefined8 *)(local_318 + 10);
        value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
        _4_4_ = in_stack_fffffffffffffa90;
        value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
        _M_payload._M_value = in_stack_fffffffffffffa8c._M_value;
        range.endLoc = in_stack_fffffffffffffa80;
        range.startLoc = in_stack_fffffffffffffa78;
        local_348 = in_stack_fffffffffffffb10;
        local_340 = in_stack_fffffffffffffb10;
        in_stack_fffffffffffffb0f =
             ASTContext::requirePositive(in_stack_fffffffffffffa70,value,range);
        if ((bool)in_stack_fffffffffffffb0f) {
          piVar7 = std::optional<int>::operator*((optional<int> *)0x9be553);
          local_360 = (unsigned_long)*piVar7;
          in_stack_fffffffffffffb00 =
               (span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                *)std::max<unsigned_long>((unsigned_long *)&local_2b8,&local_360);
          local_2b8 = in_stack_fffffffffffffb00->_M_ptr;
        }
        else {
          local_191 = 1;
        }
      }
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>,_false>
                *)in_stack_fffffffffffffa60);
  }
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x9be5b1);
  puVar8 = (undefined1 *)
           boost::unordered::
           unordered_flat_map<int,_const_slang::ast::Expression_*,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
           ::size((unordered_flat_map<int,_const_slang::ast::Expression_*,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                   *)0x9be5c5);
  if (puVar8 == (undefined1 *)((long)&(local_2b8->type).ptr + 1U)) {
    SmallVectorBase<const_slang::ast::Expression_*>::reserve
              ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffffa70,
               (size_type)in_stack_fffffffffffffa68);
    for (local_3c0 = (pointer)0x0; local_3c0 <= local_2b8;
        local_3c0 = (pointer)((long)&(local_3c0->type).ptr + 1)) {
      this_00 = &local_1d0;
      local_3cc = local_3c0._0_4_;
      local_148 = &local_3cc;
      local_70 = &local_131;
      local_140 = this_00;
      local_130 = local_148;
      local_128 = this_00;
      local_78 = local_148;
      local_68 = this_00;
      local_80 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                 ::key_from<int>(local_148);
      in_stack_fffffffffffffaf8 =
           (span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
            *)boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
              ::hash_for<int>(in_stack_fffffffffffffa60,(int *)in_stack_fffffffffffffa58);
      local_88 = in_stack_fffffffffffffaf8;
      local_90 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                 ::position_for(in_stack_fffffffffffffa60,(size_t)in_stack_fffffffffffffa58);
      local_10 = local_80;
      local_20 = local_88;
      in_stack_fffffffffffffaf0 = this_00;
      local_18 = local_90;
      local_8 = this_00;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_30,local_90);
      do {
        local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
        local_40 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                   ::groups((table_arrays<std::pair<const_int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                             *)0x9be825);
        local_40 = local_40 + local_38;
        uVar3 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          (in_stack_fffffffffffffa68,(size_t)in_stack_fffffffffffffa60);
        local_44 = uVar3;
        if (uVar3 != 0) {
          local_50 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                     ::elements((table_arrays<std::pair<const_int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                                 *)0x9be887);
          local_58 = local_50 + local_38 * 0xf;
          do {
            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            this = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                   ::pred((table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                           *)0x9be8da);
            in_stack_fffffffffffffac8 = local_10;
            in_stack_fffffffffffffad0 =
                 (try_emplace_args_t *)
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
                 ::key_from<std::pair<int_const,slang::ast::Expression_const*>>
                           ((pair<const_int,_const_slang::ast::Expression_*> *)0x9be907);
            bVar2 = std::equal_to<int>::operator()
                              (this,in_stack_fffffffffffffac8,(int *)in_stack_fffffffffffffad0);
            if (bVar2) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_int,_const_slang::ast::Expression_*>_>
              ::table_locator(&local_a8,local_40,local_5c,local_58 + local_5c);
              goto LAB_009bea11;
            }
            local_44 = local_44 - 1 & local_44;
          } while (local_44 != 0);
        }
        bVar2 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffffa60,(size_t)in_stack_fffffffffffffa58);
        if (bVar2) {
          memset(&local_a8,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_int,_const_slang::ast::Expression_*>_>
          ::table_locator(&local_a8);
          goto LAB_009bea11;
        }
        bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_30,(this_00->arrays).groups_size_mask);
      } while (bVar2);
      memset(&local_a8,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_int,_const_slang::ast::Expression_*>_>
      ::table_locator(&local_a8);
LAB_009bea11:
      bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_a8);
      if (bVar2) {
        local_b8 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                   ::make_iterator((locator *)0x9bea31);
        local_b9 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_160,&local_b8,&local_b9);
      }
      else if ((in_stack_fffffffffffffaf0->size_ctrl).size <
               (in_stack_fffffffffffffaf0->size_ctrl).ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
        ::unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,int>
                  ((table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                    *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                   CONCAT44(in_stack_fffffffffffffa8c._M_value,in_stack_fffffffffffffa88),
                   (size_t)in_stack_fffffffffffffa80,(try_emplace_args_t *)in_stack_fffffffffffffa78
                   ,(int *)in_stack_fffffffffffffa70);
        local_d0 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                   ::make_iterator((locator *)0x9beac1);
        local_e9[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_160,&local_d0,local_e9);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
        ::unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,int>
                  (this_00,CONCAT44(uVar3,in_stack_fffffffffffffad8),in_stack_fffffffffffffad0,
                   in_stack_fffffffffffffac8);
        local_100 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                    ::make_iterator((locator *)0x9beb34);
        local_119[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_160,&local_100,local_119);
      }
      ppVar9 = boost::unordered::detail::foa::
               table_iterator<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
               ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                             *)in_stack_fffffffffffffa60);
      local_3c8 = ppVar9->second;
      SmallVectorBase<const_slang::ast::Expression_*>::push_back
                ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffffa60,
                 (Expression **)in_stack_fffffffffffffa58);
    }
  }
  else if ((local_191 & 1) == 0) {
    local_3a4 = 0x140007;
    local_3b8 = (compilation->super_BumpAllocator).head;
    pbStack_3b0 = (compilation->super_BumpAllocator).endPtr;
    SVar11.endLoc._0_4_ = in_stack_fffffffffffffa88;
    SVar11.startLoc = in_stack_fffffffffffffa80;
    SVar11.endLoc._4_4_ = in_stack_fffffffffffffa8c._M_value;
    ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa94,SVar11);
    local_191 = 1;
  }
  std::
  span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
  ::span((span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
          *)0x9bebf2);
  std::
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  ::span((span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
          *)0x9bebff);
  iVar4 = SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>::copy
                    (local_2b0,local_170,src);
  local_420.syntax = (ExpressionSyntax *)CONCAT44(extraout_var_00,iVar4);
  local_420.constant = (ConstantValue *)0x0;
  EVar5 = SmallVectorBase<const_slang::ast::Expression_*>::copy(local_3a0,local_170,src_00);
  local_420._4_4_ = extraout_var_01;
  local_420.kind = EVar5;
  expr_00 = &local_420;
  local_3d8 = BumpAllocator::
              emplace<slang::ast::StructuredAssignmentPatternExpression,slang::ast::Type_const&,std::span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter_const,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter_const,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,18446744073709551615ul>,decltype(nullptr),std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                        (in_stack_fffffffffffffb18,(Type *)in_stack_fffffffffffffb10,
                         (span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
                          *)CONCAT17(in_stack_fffffffffffffb0f,in_stack_fffffffffffffb08),
                         in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                         (void **)in_stack_fffffffffffffaf0,in_stack_fffffffffffffb30,
                         (SourceRange *)in_stack_fffffffffffffb38);
  local_168 = local_3d8;
  if ((local_191 & 1) != 0) {
    local_168 = (StructuredAssignmentPatternExpression *)Expression::badExpr(compilation,expr_00);
  }
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x9bed46);
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_4UL>::~SmallVector
            ((SmallVector<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_4UL> *)
             0x9bed53);
  SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  ::~SmallMap((SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
               *)0x9bed60);
  return (Expression *)local_168;
}

Assistant:

Expression& StructuredAssignmentPatternExpression::forDynamicArray(
    Compilation& comp, const StructuredAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Type& elementType, SourceRange sourceRange) {

    bool bad = false;
    SmallMap<int32_t, const Expression*, 8> indexMap;
    SmallVector<IndexSetter, 4> indexSetters;
    size_t maxIndex = 0;

    for (auto item : syntax.items) {
        if (item->key->kind == SyntaxKind::DefaultPatternKeyExpression) {
            context.addDiag(diag::AssignmentPatternDynamicDefault, item->key->sourceRange());
            bad = true;
            continue;
        }

        // The key is either an array index or a data type setter.
        auto& keyExpr = Expression::bind(*item->key, context, ASTFlags::AllowDataType);
        if (keyExpr.bad()) {
            bad = true;
            continue;
        }

        if (keyExpr.kind == ExpressionKind::DataType) {
            context.addDiag(diag::AssignmentPatternDynamicType, item->key->sourceRange());
            bad = true;
            continue;
        }

        auto index = bindArrayIndexSetter(context, keyExpr, elementType, *item->expr, indexMap,
                                          indexSetters);
        if (!context.requirePositive(index, keyExpr.sourceRange)) {
            bad = true;
            continue;
        }

        maxIndex = std::max(maxIndex, size_t(*index));
    }

    SmallVector<const Expression*> elements;
    if (indexMap.size() != maxIndex + 1) {
        if (!bad) {
            context.addDiag(diag::AssignmentPatternMissingElements, sourceRange);
            bad = true;
        }
    }
    else {
        elements.reserve(maxIndex + 1);
        for (size_t i = 0; i <= maxIndex; i++) {
            auto expr = indexMap[int32_t(i)];
            SLANG_ASSERT(expr);
            elements.push_back(expr);
        }
    }

    auto result = comp.emplace<StructuredAssignmentPatternExpression>(
        type, std::span<const MemberSetter>{}, std::span<const TypeSetter>{},
        indexSetters.copy(comp), nullptr, elements.copy(comp), sourceRange);

    if (bad)
        return badExpr(comp, result);

    return *result;
}